

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall re2::CharClass::Contains(CharClass *this,Rune r)

{
  int iVar1;
  int m;
  int n;
  RuneRange *rr;
  Rune r_local;
  CharClass *this_local;
  
  rr = *(RuneRange **)(this + 8);
  n = *(int *)(this + 0x10);
  do {
    while( true ) {
      if (n < 1) {
        return false;
      }
      iVar1 = n / 2;
      if (r <= rr[iVar1].hi) break;
      rr = rr + (iVar1 + 1);
      n = n - (iVar1 + 1);
    }
    n = iVar1;
  } while (r < rr[iVar1].lo);
  return true;
}

Assistant:

bool CharClass::Contains(Rune r) {
  RuneRange* rr = ranges_;
  int n = nranges_;
  while (n > 0) {
    int m = n/2;
    if (rr[m].hi < r) {
      rr += m+1;
      n -= m+1;
    } else if (r < rr[m].lo) {
      n = m;
    } else {  // rr[m].lo <= r && r <= rr[m].hi
      return true;
    }
  }
  return false;
}